

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int get_sleb128(int32_t *pval,uint8_t *buf,uint8_t *buf_end)

{
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint *in_RDI;
  uint32_t val;
  int ret;
  uint local_28 [6];
  uint *local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_4 = get_leb128(local_28,in_RSI,in_RDX);
  if (local_4 < 0) {
    *local_10 = 0;
    local_4 = -1;
  }
  else {
    *local_10 = local_28[0] >> 1 ^ -(local_28[0] & 1);
  }
  return local_4;
}

Assistant:

static int get_sleb128(int32_t *pval, const uint8_t *buf,
                       const uint8_t *buf_end)
{
    int ret;
    uint32_t val;
    ret = get_leb128(&val, buf, buf_end);
    if (ret < 0) {
        *pval = 0;
        return -1;
    }
    *pval = (val >> 1) ^ -(val & 1);
    return ret;
}